

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReaderCache::processMru(PtexReaderCache *this)

{
  PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem> *pPVar1
  ;
  PtexLruItem *pPVar2;
  size_t *psVar3;
  MruList *pMVar4;
  size_t sVar5;
  PtexCachedReader *pPVar6;
  size_t sVar7;
  PtexLruItem *pPVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  iVar10 = pthread_mutex_trylock((pthread_mutex_t *)&this->_mruLock);
  if (iVar10 != 0) {
    return;
  }
  if (0x31 < this->_mruList->next) {
    pMVar4 = this->_mruList;
    this->_mruList = this->_prevMruList;
    this->_prevMruList = pMVar4;
    sVar5 = this->_maxMem;
    pPVar1 = &this->_activeFiles;
    sVar14 = this->_fileOpens;
    sVar15 = this->_blockReads;
    lVar16 = 0;
    lVar13 = 0;
    lVar11 = 0;
    do {
      do {
        pPVar6 = pMVar4->files[lVar16];
      } while (pPVar6 == (PtexCachedReader *)0x0);
      pMVar4->files[lVar16] = (PtexCachedReader *)0x0;
      sVar7 = (pPVar6->super_PtexReader)._memUsed;
      lVar13 = (lVar13 + sVar7) - pPVar6->_memUsedAccountedFor;
      pPVar6->_memUsedAccountedFor = sVar7;
      sVar7 = (pPVar6->super_PtexReader)._opens;
      lVar17 = sVar7 - pPVar6->_opensAccountedFor;
      pPVar6->_opensAccountedFor = sVar7;
      sVar7 = (pPVar6->super_PtexReader)._blockReads;
      lVar18 = sVar7 - pPVar6->_blockReadsAccountedFor;
      pPVar6->_blockReadsAccountedFor = sVar7;
      if (lVar18 != 0 || lVar17 != 0) {
        sVar14 = sVar14 + lVar17;
        this->_fileOpens = sVar14;
        sVar15 = sVar15 + lVar18;
        this->_blockReads = sVar15;
        pPVar2 = &pPVar6->_openFilesItem;
        pPVar8 = (pPVar6->_openFilesItem)._next;
        pPVar8->_prev = (pPVar6->_openFilesItem)._prev;
        ((pPVar6->_openFilesItem)._prev)->_next = pPVar8;
        (pPVar6->_openFilesItem)._prev = pPVar2;
        (pPVar6->_openFilesItem)._next = pPVar2;
        pPVar8 = (this->_openFiles)._end._prev;
        pPVar8->_next = pPVar2;
        (pPVar6->_openFilesItem)._next = &(this->_openFiles)._end;
        (pPVar6->_openFilesItem)._prev = pPVar8;
        (this->_openFiles)._end._prev = pPVar2;
      }
      if (sVar5 != 0) {
        pPVar2 = &pPVar6->_activeFilesItem;
        pPVar8 = (pPVar6->_activeFilesItem)._next;
        pPVar8->_prev = (pPVar6->_activeFilesItem)._prev;
        ((pPVar6->_activeFilesItem)._prev)->_next = pPVar8;
        (pPVar6->_activeFilesItem)._prev = pPVar2;
        (pPVar6->_activeFilesItem)._next = pPVar2;
        pPVar8 = (pPVar1->_end)._prev;
        pPVar8->_next = pPVar2;
        (pPVar6->_activeFilesItem)._next = &pPVar1->_end;
        (pPVar6->_activeFilesItem)._prev = pPVar8;
        (pPVar1->_end)._prev = pPVar2;
      }
      lVar11 = lVar11 + lVar17;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x32);
    pMVar4->next = 0;
    if (lVar13 != 0) {
      LOCK();
      psVar3 = &this->_memUsed;
      sVar5 = *psVar3;
      *psVar3 = *psVar3 + lVar13;
      UNLOCK();
      uVar12 = sVar5 + lVar13;
      if (sVar5 + lVar13 < this->_peakMemUsed) {
        uVar12 = this->_peakMemUsed;
      }
      this->_peakMemUsed = uVar12;
    }
    if (lVar11 != 0) {
      LOCK();
      psVar3 = &this->_filesOpen;
      sVar5 = *psVar3;
      *psVar3 = *psVar3 + lVar11;
      UNLOCK();
      uVar12 = sVar5 + lVar11;
      if (sVar5 + lVar11 < this->_peakFilesOpen) {
        uVar12 = this->_peakFilesOpen;
      }
      this->_peakFilesOpen = uVar12;
    }
    if (this->_maxMem == 0) {
      bVar9 = false;
    }
    else {
      bVar9 = this->_maxMem < this->_memUsed;
    }
    if (this->_maxFiles < this->_filesOpen) {
      pruneFiles(this);
    }
    if (bVar9) {
      pruneData(this);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mruLock);
  return;
}

Assistant:

void PtexReaderCache::processMru()
{
    // use a non-blocking lock so we can proceed as soon as space has been freed in the mru list
    // (which happens almost immediately in the processMru thread that has the lock)
    if (!_mruLock.trylock()) return;
    if (_mruList->next < numMruFiles) {
        _mruLock.unlock();
        return;
    }

    // switch mru buffers and reset slot counter so other threads can proceed immediately
    MruList* mruList = _mruList;
    AtomicStore(&_mruList, _prevMruList);
    _prevMruList = mruList;

    // extract relevant stats and add to open/active list
    size_t memUsedChange = 0, filesOpenChange = 0;
    for (int i = 0; i < numMruFiles; ++i) {
        PtexCachedReader* reader;
        do { reader = mruList->files[i]; } while (!reader); // loop on (unlikely) race condition
        mruList->files[i] = 0;
        memUsedChange += reader->getMemUsedChange();
        size_t opens = reader->getOpensChange();
        size_t blockReads = reader->getBlockReadsChange();
        filesOpenChange += opens;
        if (opens || blockReads) {
            _fileOpens += opens;
            _blockReads += blockReads;
            _openFiles.push(reader);
        }
        if (_maxMem) {
            _activeFiles.push(reader);
        }
    }
    AtomicStore(&mruList->next, 0);
    adjustMemUsed(memUsedChange);
    adjustFilesOpen(filesOpenChange);

    bool shouldPruneFiles = _filesOpen > _maxFiles;
    bool shouldPruneData = _maxMem && _memUsed > _maxMem;

    if (shouldPruneFiles) {
        pruneFiles();
    }
    if (shouldPruneData) {
        pruneData();
    }
    _mruLock.unlock();
}